

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest.cpp
# Opt level: O3

void ThisIsALongFuctionNameToTestFunctionNameFixup(void)

{
  char function_name [16];
  undefined1 auStack_18 [8];
  char local_10;
  
  local_10 = '\x7f';
  function_name_fixup("void ThisIsALongFuctionNameToTestFunctionNameFixup()",auStack_18,8);
  if (local_10 != '\x7f') {
    jh_log_print(1,"void ThisIsALongFuctionNameToTestFunctionNameFixup()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest.cpp"
                 ,0x27,"Buffer overrun in function_name_fixup %c");
  }
  printf("Results: %s\n",auStack_18);
  return;
}

Assistant:

void ThisIsALongFuctionNameToTestFunctionNameFixup()
{
	char function_name[ 16 ];
	function_name[ 8 ] = 0x7f;
	
	function_name_fixup( __PRETTY_FUNCTION__, function_name, 8 );

	if ( function_name[ 8 ] != 0x7f )
		LOG_ERR_FATAL( "Buffer overrun in function_name_fixup %c", function_name[ 8 ] );

	printf( "Results: %s\n", function_name );
}